

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

QString * __thiscall
QProcessEnvironment::value(QProcessEnvironment *this,QString *name,QString *defaultValue)

{
  long lVar1;
  bool bVar2;
  QProcessEnvironmentPrivate *this_00;
  QProcessEnvironmentPrivate *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  QString *in_stack_ffffffffffffff58;
  Value *in_stack_ffffffffffffff60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QSharedDataPointer<QProcessEnvironmentPrivate>::operator!
                    ((QSharedDataPointer<QProcessEnvironmentPrivate> *)0x78f1dc);
  if (bVar2) {
    QString::QString((QString *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    QSharedDataPointer<QProcessEnvironmentPrivate>::operator->
              ((QSharedDataPointer<QProcessEnvironmentPrivate> *)0x78f212);
    QSharedDataPointer<QProcessEnvironmentPrivate>::operator->
              ((QSharedDataPointer<QProcessEnvironmentPrivate> *)0x78f225);
    QProcessEnvironmentPrivate::prepareName(in_RSI,in_RDI);
    QMap<QByteArray,_QProcEnvValue>::constFind
              ((QMap<QByteArray,_QProcEnvValue> *)in_stack_ffffffffffffff58,(QByteArray *)0x78f24e);
    QByteArray::~QByteArray((QByteArray *)0x78f26f);
    QSharedDataPointer<QProcessEnvironmentPrivate>::operator->
              ((QSharedDataPointer<QProcessEnvironmentPrivate> *)0x78f279);
    QMap<QByteArray,_QProcEnvValue>::constEnd
              ((QMap<QByteArray,_QProcEnvValue> *)in_stack_ffffffffffffff58);
    bVar2 = ::operator==((const_iterator *)in_stack_ffffffffffffff60,
                         (const_iterator *)in_stack_ffffffffffffff58);
    if (bVar2) {
      QString::QString((QString *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    else {
      this_00 = QSharedDataPointer<QProcessEnvironmentPrivate>::operator->
                          ((QSharedDataPointer<QProcessEnvironmentPrivate> *)0x78f2de);
      QMap<QByteArray,_QProcEnvValue>::const_iterator::value((const_iterator *)0x78f2f0);
      QProcessEnvironmentPrivate::valueToString(this_00,in_stack_ffffffffffffff60);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QProcessEnvironment::value(const QString &name, const QString &defaultValue) const
{
    if (!d)
        return defaultValue;

    const auto it = d->vars.constFind(d->prepareName(name));
    if (it == d->vars.constEnd())
        return defaultValue;

    return d->valueToString(it.value());
}